

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void shell_helper_no_limit(char *cmd)

{
  process shell;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  process local_498;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"sh",&local_4f9);
  procxx::process::process<>(&local_498,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"-c",&local_4f9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
             &local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,cmd,&local_4f9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
             &local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  procxx::process::exec(&local_498);
  procxx::process::~process(&local_498);
  return;
}

Assistant:

void shell_helper_no_limit(const char* cmd) {
  procxx::process shell{"sh"};
  procxx::process::limits_t limits;

  shell.add_argument("-c");
  shell.add_argument(cmd);

  shell.exec();
}